

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_0::anon_unknown_18::ScalarValueToVertexAttribute<unsigned_char>
               (Value *value,string *name,VertexAttributeFormat format,VertexAttribute *dst,
               string *err)

{
  pointer puVar1;
  size_t sVar2;
  uchar *puVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  ostringstream ss_e;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  sVar2 = VertexAttributeFormatSize(format);
  if ((int)sVar2 == 1) {
    puVar3 = tinyusdz::value::Value::as<unsigned_char>(value,false);
    if (puVar3 != (uchar *)0x0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,1);
      *(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = *puVar3;
      dst->elementSize = 1;
      dst->stride = 0;
      dst->format = format;
      dst->variability = Constant;
      ::std::__cxx11::string::_M_assign((string *)dst);
      puVar1 = (dst->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((dst->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar1) {
        return true;
      }
      (dst->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"ScalarValueToVertexAttribute",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a0,0x4a2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar6 = "[Internal error] value is not scalar-typed value.";
    lVar5 = 0x31;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"ScalarValueToVertexAttribute",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a0,0x491);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar6 = "format size mismatch.";
    lVar5 = 0x15;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar6,lVar5);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1c0);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  ::std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool ScalarValueToVertexAttribute(const value::Value &value,
                                  const std::string &name,
                                  const VertexAttributeFormat format,
                                  VertexAttribute &dst, std::string *err) {
  if (VertexAttributeFormatSize(format) != sizeof(UnderlyingTy)) {
    PUSH_ERROR_AND_RETURN("format size mismatch.");
    return false;
  }

  if (auto pv = value.as<UnderlyingTy>()) {
    dst.data.resize(sizeof(UnderlyingTy));
    memcpy(dst.data.data(), pv, sizeof(UnderlyingTy));

    dst.elementSize = 1;
    dst.stride = 0;
    dst.format = format;
    dst.variability = VertexVariability::Constant;
    dst.name = name;
    dst.indices.clear();
    return true;
  }

  PUSH_ERROR_AND_RETURN("[Internal error] value is not scalar-typed value.");
}